

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall icu_63::number::impl::DecimalQuantity::setBcdToZero(DecimalQuantity *this)

{
  if (this->usingBytes == true) {
    uprv_free_63((this->fBCD).bcdBytes.ptr);
    (this->fBCD).bcdBytes.ptr = (int8_t *)0x0;
    this->usingBytes = false;
  }
  (this->fBCD).bcdBytes.ptr = (int8_t *)0x0;
  this->scale = 0;
  this->precision = 0;
  this->isApproximate = '\0';
  this->origDouble = 0.0;
  this->origDelta = 0;
  return;
}

Assistant:

void DecimalQuantity::setBcdToZero() {
    if (usingBytes) {
        uprv_free(fBCD.bcdBytes.ptr);
        fBCD.bcdBytes.ptr = nullptr;
        usingBytes = false;
    }
    fBCD.bcdLong = 0L;
    scale = 0;
    precision = 0;
    isApproximate = false;
    origDouble = 0;
    origDelta = 0;
}